

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O1

int quicly_sendbuf_write(quicly_stream_t *stream,quicly_sendbuf_t *sb,void *src,size_t len)

{
  int iVar1;
  void *__dest;
  quicly_sendbuf_vec_t vec;
  quicly_sendbuf_vec_t local_48;
  
  local_48.cb = &quicly_sendbuf_write::raw_callbacks;
  local_48.cbdata = (void *)0x0;
  local_48.len = len;
  if ((stream->sendstate).final_size != 0xffffffffffffffff) {
    __assert_fail("quicly_sendstate_is_open(&stream->sendstate)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                  ,0x8a,
                  "int quicly_sendbuf_write(quicly_stream_t *, quicly_sendbuf_t *, const void *, size_t)"
                 );
  }
  __dest = malloc(len);
  local_48.cbdata = __dest;
  if (__dest == (void *)0x0) {
    iVar1 = 0x201;
  }
  else {
    memcpy(__dest,src,len);
    iVar1 = quicly_sendbuf_write_vec(stream,sb,&local_48);
    if (iVar1 == 0) {
      return 0;
    }
  }
  free(__dest);
  return iVar1;
}

Assistant:

int quicly_sendbuf_write(quicly_stream_t *stream, quicly_sendbuf_t *sb, const void *src, size_t len)
{
    static const quicly_streambuf_sendvec_callbacks_t raw_callbacks = {flatten_raw, discard_raw};
    quicly_sendbuf_vec_t vec = {&raw_callbacks, len, NULL};
    int ret;

    assert(quicly_sendstate_is_open(&stream->sendstate));

    if ((vec.cbdata = malloc(len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    memcpy(vec.cbdata, src, len);
    if ((ret = quicly_sendbuf_write_vec(stream, sb, &vec)) != 0)
        goto Error;
    return 0;

Error:
    free(vec.cbdata);
    return ret;
}